

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O0

string * __thiscall
VideoHppGenerator::generateEnums_abi_cxx11_(string *__return_storage_ptr__,VideoHppGenerator *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_170;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_139;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  undefined1 local_f0 [64];
  string local_b0;
  reference local_90;
  ExtensionData *extension;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>
  *__range1;
  string enums;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string enumsTemplate;
  VideoHppGenerator *this_local;
  
  enumsTemplate.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,
             "\n  //=============\n  //=== ENUMs ===\n  //=============\n\n${enums}\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&__range1);
  __end1 = std::
           vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>
           ::begin(&this->m_extensions);
  extension = (ExtensionData *)
              std::
              vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>
              ::end(&this->m_extensions);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_VideoHppGenerator::ExtensionData_*,_std::vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>_>
                      (&__end1,(__normal_iterator<const_VideoHppGenerator::ExtensionData_*,_std::vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>_>
                                *)&extension);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_90 = __gnu_cxx::
               __normal_iterator<const_VideoHppGenerator::ExtensionData_*,_std::vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>_>
               ::operator*(&__end1);
    generateEnums(&local_b0,this,&local_90->requireData,&local_90->name);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
               &local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    __gnu_cxx::
    __normal_iterator<const_VideoHppGenerator::ExtensionData_*,_std::vector<VideoHppGenerator::ExtensionData,_std::allocator<VideoHppGenerator::ExtensionData>_>_>
    ::operator++(&__end1);
  }
  local_138 = &local_130;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (local_138,(char (*) [6])"enums",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1);
  local_f0._0_8_ = &local_130;
  local_f0._8_8_ = 1;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_13a);
  __l._M_len = local_f0._8_8_;
  __l._M_array = (iterator)local_f0._0_8_;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)(local_f0 + 0x10),__l,&local_139,&local_13a);
  replaceWithMap(__return_storage_ptr__,(string *)local_38,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_f0 + 0x10));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)(local_f0 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_13a);
  local_170 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_f0;
  do {
    local_170 = local_170 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_170);
  } while (local_170 != &local_130);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string VideoHppGenerator::generateEnums() const
{
  {
    const std::string enumsTemplate = R"(
  //=============
  //=== ENUMs ===
  //=============

${enums}
)";

    std::string enums;
    for ( auto const & extension : m_extensions )
    {
      enums += generateEnums( extension.requireData, extension.name );
    }

    return replaceWithMap( enumsTemplate, { { "enums", enums } } );
  }
}